

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O1

void __thiscall
CsSignal::PendingSlot::PendingSlot
          (PendingSlot *this,SignalBase *sender,
          unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
          *signal_Bento,SlotBase *receiver,
          unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
          *slot_Bento,
          unique_ptr<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
          *teaCup_Data)

{
  this->m_sender = sender;
  (this->m_signal_Bento)._M_t.
  super___uniq_ptr_impl<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_CsSignal::Internal::BentoAbstract_*,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (signal_Bento->_M_t).
       super___uniq_ptr_impl<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
       ._M_t.
       super__Tuple_impl<0UL,_CsSignal::Internal::BentoAbstract_*,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
       .super__Head_base<0UL,_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
  (signal_Bento->_M_t).
  super___uniq_ptr_impl<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_CsSignal::Internal::BentoAbstract_*,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (BentoAbstract *)0x0;
  this->m_receiver = receiver;
  (this->m_slot_Bento)._M_t.
  super___uniq_ptr_impl<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_CsSignal::Internal::BentoAbstract_*,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (slot_Bento->_M_t).
       super___uniq_ptr_impl<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
       ._M_t.
       super__Tuple_impl<0UL,_CsSignal::Internal::BentoAbstract_*,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
       .super__Head_base<0UL,_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
  (slot_Bento->_M_t).
  super___uniq_ptr_impl<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_CsSignal::Internal::BentoAbstract_*,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (BentoAbstract *)0x0;
  (this->m_teaCup_Data)._M_t.
  super___uniq_ptr_impl<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_CsSignal::Internal::TeaCupAbstract_*,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
  .super__Head_base<0UL,_CsSignal::Internal::TeaCupAbstract_*,_false>._M_head_impl =
       (teaCup_Data->_M_t).
       super___uniq_ptr_impl<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
       ._M_t.
       super__Tuple_impl<0UL,_CsSignal::Internal::TeaCupAbstract_*,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
       .super__Head_base<0UL,_CsSignal::Internal::TeaCupAbstract_*,_false>._M_head_impl;
  (teaCup_Data->_M_t).
  super___uniq_ptr_impl<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_CsSignal::Internal::TeaCupAbstract_*,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
  .super__Head_base<0UL,_CsSignal::Internal::TeaCupAbstract_*,_false>._M_head_impl =
       (TeaCupAbstract *)0x0;
  return;
}

Assistant:

CsSignal::PendingSlot::PendingSlot(SignalBase *sender, std::unique_ptr<Internal::BentoAbstract> signal_Bento,
                  SlotBase *receiver, std::unique_ptr<Internal::BentoAbstract> slot_Bento,
                  std::unique_ptr<Internal::TeaCupAbstract> teaCup_Data)
   : m_sender(sender), m_signal_Bento(std::move(signal_Bento)), m_receiver(receiver),
     m_slot_Bento(std::move(slot_Bento)), m_teaCup_Data(std::move(teaCup_Data))
{
}